

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  ushort uVar5;
  size_t sVar6;
  long lVar7;
  BIT_DStream_status BVar8;
  BIT_DStream_status BVar9;
  BIT_DStream_status BVar10;
  BIT_DStream_status BVar11;
  size_t sVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 *puVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  void *pvVar25;
  undefined1 *puVar26;
  ulong uVar27;
  undefined1 *puVar28;
  BIT_DStream_t bitD4;
  BIT_DStream_t bitD3;
  BIT_DStream_t bitD2;
  BIT_DStream_t bitD1;
  
  if (9 < cSrcSize) {
    uVar19 = (ulong)*cSrc;
    uVar16 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar27 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar15 = uVar27 + 6 + uVar19 + uVar16;
    sVar12 = 0xffffffffffffffec;
    if (uVar15 <= cSrcSize) {
      uVar5 = *(ushort *)((long)DTable + 2);
      sVar12 = BIT_initDStream(&bitD1,(void *)((long)cSrc + 6),uVar19);
      if (sVar12 < 0xffffffffffffff89) {
        pvVar25 = (void *)((long)cSrc + uVar19 + 6);
        sVar12 = BIT_initDStream(&bitD2,pvVar25,uVar16);
        if (sVar12 < 0xffffffffffffff89) {
          pvVar25 = (void *)((long)pvVar25 + uVar16);
          sVar12 = BIT_initDStream(&bitD3,pvVar25,uVar27);
          if ((sVar12 < 0xffffffffffffff89) &&
             (sVar12 = BIT_initDStream(&bitD4,(void *)((long)pvVar25 + uVar27),cSrcSize - uVar15),
             sVar12 < 0xffffffffffffff89)) {
            puVar2 = (undefined1 *)((long)dst + dstSize);
            uVar27 = dstSize + 3 >> 2;
            puVar3 = (undefined1 *)((long)dst + uVar27);
            puVar13 = puVar3 + uVar27;
            puVar14 = puVar13 + uVar27;
            BVar8 = BIT_reloadDStream(&bitD1);
            BVar9 = BIT_reloadDStream(&bitD2);
            BVar10 = BIT_reloadDStream(&bitD3);
            BVar11 = BIT_reloadDStream(&bitD4);
            puVar1 = puVar2 + -3;
            uVar15 = (ulong)(-(uint)uVar5 & 0x3f);
            lVar7 = uVar27 * 3;
            for (; (puVar20 = (undefined1 *)((long)dst + lVar7),
                   (BVar11 == BIT_DStream_unfinished && BVar10 == BIT_DStream_unfinished) &&
                   (BVar9 == BIT_DStream_unfinished && BVar8 == BIT_DStream_unfinished) &&
                   (puVar20 < puVar1)); dst = (void *)((long)dst + 4)) {
              uVar19 = (bitD1.bitContainer << ((ulong)bitD1.bitsConsumed & 0x3f)) >> uVar15;
              uVar21 = *(byte *)((long)DTable + uVar19 * 2 + 5) + bitD1.bitsConsumed;
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD2.bitContainer << ((ulong)bitD2.bitsConsumed & 0x3f)) >> uVar15;
              uVar22 = *(byte *)((long)DTable + uVar19 * 2 + 5) + bitD2.bitsConsumed;
              *(undefined1 *)((long)dst + uVar27) = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD3.bitContainer << ((ulong)bitD3.bitsConsumed & 0x3f)) >> uVar15;
              uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + bitD3.bitsConsumed;
              *(undefined1 *)((long)dst + uVar27 * 2) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD4.bitContainer << ((ulong)bitD4.bitsConsumed & 0x3f)) >> uVar15;
              uVar24 = *(byte *)((long)DTable + uVar19 * 2 + 5) + bitD4.bitsConsumed;
              *(undefined1 *)((long)dst + lVar7) = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD1.bitContainer << ((ulong)uVar21 & 0x3f)) >> uVar15;
              uVar21 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar21;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD2.bitContainer << ((ulong)uVar22 & 0x3f)) >> uVar15;
              uVar22 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar22;
              *(undefined1 *)((long)dst + uVar27 + 1) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
              uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
              *(undefined1 *)((long)dst + uVar27 * 2 + 1) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD4.bitContainer << ((ulong)uVar24 & 0x3f)) >> uVar15;
              uVar24 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar24;
              *(undefined1 *)((long)dst + lVar7 + 1) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD1.bitContainer << ((ulong)uVar21 & 0x3f)) >> uVar15;
              uVar21 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar21;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD2.bitContainer << ((ulong)uVar22 & 0x3f)) >> uVar15;
              uVar22 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar22;
              *(undefined1 *)((long)dst + uVar27 + 2) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
              uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
              *(undefined1 *)((long)dst + uVar27 * 2 + 2) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD4.bitContainer << ((ulong)uVar24 & 0x3f)) >> uVar15;
              uVar24 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar24;
              *(undefined1 *)((long)dst + lVar7 + 2) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD1.bitContainer << ((ulong)uVar21 & 0x3f)) >> uVar15;
              bitD1.bitsConsumed = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar21;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD2.bitContainer << ((ulong)uVar22 & 0x3f)) >> uVar15;
              bitD2.bitsConsumed = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar22;
              *(undefined1 *)((long)dst + uVar27 + 3) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
              bitD3.bitsConsumed = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
              *(undefined1 *)((long)dst + uVar27 * 2 + 3) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              uVar19 = (bitD4.bitContainer << ((ulong)uVar24 & 0x3f)) >> uVar15;
              bitD4.bitsConsumed = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar24;
              *(undefined1 *)((long)dst + lVar7 + 3) =
                   *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
              BIT_reloadDStream(&bitD1);
              BIT_reloadDStream(&bitD2);
              BIT_reloadDStream(&bitD3);
              BIT_reloadDStream(&bitD4);
            }
            puVar26 = (undefined1 *)((long)dst + uVar27);
            puVar28 = (undefined1 *)((long)dst + uVar27 * 2);
            sVar12 = 0xffffffffffffffec;
            if (puVar28 <= puVar14 && (puVar26 <= puVar13 && dst <= puVar3)) {
              while( true ) {
                BVar8 = BIT_reloadDStream(&bitD1);
                uVar27 = (ulong)bitD1.bitsConsumed;
                if ((puVar3 + -3 <= dst) || (BVar8 != BIT_DStream_unfinished)) break;
                uVar27 = (bitD1.bitContainer << (uVar27 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar27 * 2 + 5) + bitD1.bitsConsumed;
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
                uVar27 = (bitD1.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar27 * 2 + 5) + uVar23;
                *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
                uVar27 = (bitD1.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar27 * 2 + 5) + uVar23;
                *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
                uVar27 = (bitD1.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                bitD1.bitsConsumed = *(byte *)((long)DTable + uVar27 * 2 + 5) + uVar23;
                *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
                dst = (void *)((long)dst + 4);
              }
              for (; dst < puVar3; dst = (void *)((long)dst + 1)) {
                uVar19 = (bitD1.bitContainer << (uVar27 & 0x3f)) >> uVar15;
                bVar4 = *(byte *)((long)DTable + uVar19 * 2 + 5);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
                uVar27 = (ulong)((uint)bVar4 + (int)uVar27);
              }
              while( true ) {
                BVar8 = BIT_reloadDStream(&bitD2);
                uVar19 = (ulong)bitD2.bitsConsumed;
                if ((puVar13 + -3 <= puVar26) || (BVar8 != BIT_DStream_unfinished)) break;
                uVar19 = (bitD2.bitContainer << (uVar19 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + bitD2.bitsConsumed;
                *puVar26 = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
                uVar19 = (bitD2.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
                puVar26[1] = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
                uVar19 = (bitD2.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
                puVar26[2] = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
                uVar19 = (bitD2.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                bitD2.bitsConsumed = *(byte *)((long)DTable + uVar19 * 2 + 5) + uVar23;
                puVar26[3] = *(undefined1 *)((long)DTable + uVar19 * 2 + 4);
                puVar26 = puVar26 + 4;
              }
              for (; puVar26 < puVar13; puVar26 = puVar26 + 1) {
                uVar16 = (bitD2.bitContainer << (uVar19 & 0x3f)) >> uVar15;
                bVar4 = *(byte *)((long)DTable + uVar16 * 2 + 5);
                *puVar26 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar19 = (ulong)((uint)bVar4 + (int)uVar19);
              }
              while( true ) {
                BVar8 = BIT_reloadDStream(&bitD3);
                uVar16 = (ulong)bitD3.bitsConsumed;
                if ((puVar14 + -3 <= puVar28) || (BVar8 != BIT_DStream_unfinished)) break;
                uVar16 = (bitD3.bitContainer << (uVar16 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar16 * 2 + 5) + bitD3.bitsConsumed;
                *puVar28 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar16 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar16 * 2 + 5) + uVar23;
                puVar28[1] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar16 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar16 * 2 + 5) + uVar23;
                puVar28[2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar16 = (bitD3.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                bitD3.bitsConsumed = *(byte *)((long)DTable + uVar16 * 2 + 5) + uVar23;
                puVar28[3] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                puVar28 = puVar28 + 4;
              }
              for (; puVar28 < puVar14; puVar28 = puVar28 + 1) {
                uVar17 = (bitD3.bitContainer << (uVar16 & 0x3f)) >> uVar15;
                bVar4 = *(byte *)((long)DTable + uVar17 * 2 + 5);
                *puVar28 = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                uVar16 = (ulong)((uint)bVar4 + (int)uVar16);
              }
              while( true ) {
                BVar8 = BIT_reloadDStream(&bitD4);
                uVar17 = (ulong)bitD4.bitsConsumed;
                if ((puVar1 <= puVar20) || (BVar8 != BIT_DStream_unfinished)) break;
                uVar17 = (bitD4.bitContainer << (uVar17 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar17 * 2 + 5) + bitD4.bitsConsumed;
                *puVar20 = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                uVar17 = (bitD4.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar17 * 2 + 5) + uVar23;
                puVar20[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                uVar17 = (bitD4.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                uVar23 = *(byte *)((long)DTable + uVar17 * 2 + 5) + uVar23;
                puVar20[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                uVar17 = (bitD4.bitContainer << ((ulong)uVar23 & 0x3f)) >> uVar15;
                bitD4.bitsConsumed = *(byte *)((long)DTable + uVar17 * 2 + 5) + uVar23;
                puVar20[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                puVar20 = puVar20 + 4;
              }
              for (; puVar20 < puVar2; puVar20 = puVar20 + 1) {
                uVar18 = (bitD4.bitContainer << (uVar17 & 0x3f)) >> uVar15;
                bVar4 = *(byte *)((long)DTable + uVar18 * 2 + 5);
                *puVar20 = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
                uVar17 = (ulong)((uint)bVar4 + (int)uVar17);
              }
              sVar6 = 0xffffffffffffffec;
              if ((int)uVar17 != 0x40) {
                dstSize = sVar6;
              }
              if (bitD4.ptr != bitD4.start) {
                dstSize = sVar6;
              }
              if ((int)uVar16 != 0x40) {
                dstSize = sVar6;
              }
              if (bitD3.ptr != bitD3.start) {
                dstSize = sVar6;
              }
              if ((int)uVar19 != 0x40) {
                dstSize = sVar6;
              }
              if (bitD2.ptr != bitD2.start) {
                dstSize = sVar6;
              }
              if ((int)uVar27 != 0x40) {
                dstSize = sVar6;
              }
              sVar12 = dstSize;
              if (bitD1.ptr != bitD1.start) {
                sVar12 = sVar6;
              }
            }
          }
        }
      }
    }
    return sVar12;
  }
  return 0xffffffffffffffec;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X1_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    /* Check */
    if (cSrcSize < 10) return ERROR(corruption_detected);  /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        const void* const dtPtr = DTable + 1;
        const HUF_DEltX1* const dt = (const HUF_DEltX1*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        const size_t segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        U32 endSignal = BIT_DStream_unfinished;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;

        if (length4 > cSrcSize) return ERROR(corruption_detected);   /* overflow */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* up to 16 symbols per loop (4 symbols per stream) in 64-bit mode */
        endSignal = BIT_reloadDStream(&bitD1) | BIT_reloadDStream(&bitD2) | BIT_reloadDStream(&bitD3) | BIT_reloadDStream(&bitD4);
        while ( (endSignal==BIT_DStream_unfinished) && (op4<(oend-3)) ) {
            HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_1(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_1(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_1(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_1(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_0(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_0(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_0(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_0(op4, &bitD4);
            BIT_reloadDStream(&bitD1);
            BIT_reloadDStream(&bitD2);
            BIT_reloadDStream(&bitD3);
            BIT_reloadDStream(&bitD4);
        }

        /* check corruption */
        /* note : should not be necessary : op# advance in lock step, and we control op4.
         *        but curiously, binary generated by gcc 7.2 & 7.3 with -mbmi2 runs faster when >=1 test is present */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 supposed already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX1(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX1(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX1(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX1(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}